

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O2

bool __thiscall
google::protobuf::DescriptorBuilder::OptionInterpreter::ExamineIfOptionIsSet
          (OptionInterpreter *this,const_iterator intermediate_fields_iter,
          const_iterator intermediate_fields_end,FieldDescriptor *innermost_field,
          string *debug_msg_name,UnknownFieldSet *unknown_fields)

{
  uint *puVar1;
  uint uVar2;
  int value;
  vector<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_> *pvVar3;
  pointer pUVar4;
  bool bVar5;
  string *data;
  LogMessage *pLVar6;
  long lVar7;
  byte bVar8;
  byte unaff_BPL;
  long lVar9;
  long lVar10;
  UnknownFieldSet intermediate_unknown_fields;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  if (intermediate_fields_iter._M_current == intermediate_fields_end._M_current) {
    pvVar3 = unknown_fields->fields_;
    lVar9 = -1;
    lVar10 = 0;
    do {
      if (pvVar3 == (vector<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_>
                     *)0x0) {
        lVar7 = 0;
      }
      else {
        lVar7 = (long)(int)((ulong)((long)(pvVar3->
                                          super__Vector_base<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_>
                                          )._M_impl.super__Vector_impl_data._M_finish -
                                   (long)(pvVar3->
                                         super__Vector_base<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_>
                                         )._M_impl.super__Vector_impl_data._M_start) >> 4);
      }
      lVar9 = lVar9 + 1;
      if (lVar7 <= lVar9) goto LAB_001e7984;
      puVar1 = (uint *)(&((pvVar3->
                          super__Vector_base<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_>
                          )._M_impl.super__Vector_impl_data._M_start)->field_0x0 + lVar10);
      lVar10 = lVar10 + 0x10;
    } while ((*puVar1 & 0x1fffffff) != *(uint *)(innermost_field + 0x28));
    std::operator+(&local_50,"Option \"",debug_msg_name);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &intermediate_unknown_fields,&local_50,"\" was already set.");
    unaff_BPL = AddNameError(this,(string *)&intermediate_unknown_fields);
    std::__cxx11::string::~string((string *)&intermediate_unknown_fields);
    std::__cxx11::string::~string((string *)&local_50);
LAB_001e7984:
    bVar8 = lVar7 <= lVar9 | unaff_BPL;
LAB_001e79de:
    return (bool)(bVar8 & 1);
  }
  lVar10 = 0;
  lVar9 = 0;
  do {
    pvVar3 = unknown_fields->fields_;
    if (pvVar3 == (vector<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_>
                   *)0x0) {
      lVar7 = 0;
    }
    else {
      lVar7 = (long)(int)((ulong)((long)(pvVar3->
                                        super__Vector_base<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_>
                                        )._M_impl.super__Vector_impl_data._M_finish -
                                 (long)(pvVar3->
                                       super__Vector_base<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_>
                                       )._M_impl.super__Vector_impl_data._M_start) >> 4);
    }
    bVar8 = lVar7 <= lVar9;
    if (lVar7 <= lVar9) goto LAB_001e79de;
    pUVar4 = (pvVar3->
             super__Vector_base<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_>
             )._M_impl.super__Vector_impl_data._M_start;
    uVar2 = *(uint *)(&pUVar4->field_0x0 + lVar10);
    if ((uVar2 & 0x1fffffff) == *(uint *)(*intermediate_fields_iter._M_current + 0x28)) {
      value = *(int *)(*intermediate_fields_iter._M_current + 0x2c);
      if (value != 10) {
        if (value != 0xb) {
          internal::LogMessage::LogMessage
                    ((LogMessage *)&intermediate_unknown_fields,LOGLEVEL_DFATAL,
                     "/workspace/llm4binary/github/license_all_cmakelists_1510/chai2010[P]protorpc/src/google/protobuf/descriptor.cc"
                     ,0x11ca);
          pLVar6 = internal::LogMessage::operator<<
                             ((LogMessage *)&intermediate_unknown_fields,
                              "Invalid wire type for CPPTYPE_MESSAGE: ");
          pLVar6 = internal::LogMessage::operator<<(pLVar6,value);
          internal::LogFinisher::operator=((LogFinisher *)&local_50,pLVar6);
          internal::LogMessage::~LogMessage((LogMessage *)&intermediate_unknown_fields);
LAB_001e79dc:
          bVar8 = 0;
          goto LAB_001e79de;
        }
        if ((uVar2 & 0xe0000000) == 0x60000000) {
          UnknownFieldSet::UnknownFieldSet(&intermediate_unknown_fields);
          data = UnknownField::length_delimited_abi_cxx11_
                           ((UnknownField *)(&pUVar4->field_0x0 + lVar10));
          bVar5 = UnknownFieldSet::ParseFromString(&intermediate_unknown_fields,data);
          if ((bVar5) &&
             (bVar5 = ExamineIfOptionIsSet
                                (this,(const_iterator)(intermediate_fields_iter._M_current + 1),
                                 intermediate_fields_end,innermost_field,debug_msg_name,
                                 &intermediate_unknown_fields), !bVar5)) {
            UnknownFieldSet::~UnknownFieldSet(&intermediate_unknown_fields);
            goto LAB_001e79dc;
          }
          UnknownFieldSet::~UnknownFieldSet(&intermediate_unknown_fields);
        }
      }
    }
    lVar9 = lVar9 + 1;
    lVar10 = lVar10 + 0x10;
  } while( true );
}

Assistant:

bool DescriptorBuilder::OptionInterpreter::ExamineIfOptionIsSet(
    vector<const FieldDescriptor*>::const_iterator intermediate_fields_iter,
    vector<const FieldDescriptor*>::const_iterator intermediate_fields_end,
    const FieldDescriptor* innermost_field, const string& debug_msg_name,
    const UnknownFieldSet& unknown_fields) {
  // We do linear searches of the UnknownFieldSet and its sub-groups.  This
  // should be fine since it's unlikely that any one options structure will
  // contain more than a handful of options.

  if (intermediate_fields_iter == intermediate_fields_end) {
    // We're at the innermost submessage.
    for (int i = 0; i < unknown_fields.field_count(); i++) {
      if (unknown_fields.field(i).number() == innermost_field->number()) {
        return AddNameError("Option \"" + debug_msg_name +
                            "\" was already set.");
      }
    }
    return true;
  }

  for (int i = 0; i < unknown_fields.field_count(); i++) {
    if (unknown_fields.field(i).number() ==
        (*intermediate_fields_iter)->number()) {
      const UnknownField* unknown_field = &unknown_fields.field(i);
      FieldDescriptor::Type type = (*intermediate_fields_iter)->type();
      // Recurse into the next submessage.
      switch (type) {
        case FieldDescriptor::TYPE_MESSAGE:
          if (unknown_field->type() == UnknownField::TYPE_LENGTH_DELIMITED) {
            UnknownFieldSet intermediate_unknown_fields;
            if (intermediate_unknown_fields.ParseFromString(
                    unknown_field->length_delimited()) &&
                !ExamineIfOptionIsSet(intermediate_fields_iter + 1,
                                      intermediate_fields_end,
                                      innermost_field, debug_msg_name,
                                      intermediate_unknown_fields)) {
              return false;  // Error already added.
            }
          }
          break;

        case FieldDescriptor::TYPE_GROUP:
          if (unknown_field->type() == UnknownField::TYPE_GROUP) {
            if (!ExamineIfOptionIsSet(intermediate_fields_iter + 1,
                                      intermediate_fields_end,
                                      innermost_field, debug_msg_name,
                                      unknown_field->group())) {
              return false;  // Error already added.
            }
          }
          break;

        default:
          GOOGLE_LOG(FATAL) << "Invalid wire type for CPPTYPE_MESSAGE: " << type;
          return false;
      }
    }
  }
  return true;
}